

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rmq.hpp
# Opt level: O3

void __thiscall
rmq<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
::rmq(rmq<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
      *this,__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
            begin,
     __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
     end,unsigned_long superblock_size,unsigned_long block_size)

{
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *this_00;
  ulong *puVar1;
  ushort uVar2;
  pointer pvVar3;
  long *plVar4;
  pointer pvVar5;
  pointer puVar6;
  pointer puVar7;
  difference_type __d;
  ulong *puVar8;
  long lVar9;
  ulong uVar10;
  ulong *puVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  size_type __n;
  ulong *puVar16;
  ulong uVar17;
  unsigned_long uVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  ulong *puVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  unsigned_long uVar26;
  ushort uVar27;
  ulong uVar28;
  ulong *puVar29;
  rmq<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
  *prVar30;
  allocator_type local_c9;
  rmq<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
  *local_c8;
  ulong *local_c0;
  vector<std::vector<unsigned_short,std::allocator<unsigned_short>>,std::allocator<std::vector<unsigned_short,std::allocator<unsigned_short>>>>
  *local_b8;
  ulong local_b0;
  pointer local_a8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_a0;
  unsigned_long local_88;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *local_80;
  ulong local_78;
  long local_70;
  ulong local_68;
  long local_60;
  ulong local_58;
  long local_50;
  long local_48;
  long local_40;
  ulong local_38;
  
  (this->_begin)._M_current = begin._M_current;
  (this->_end)._M_current = end._M_current;
  this->superblock_size = superblock_size;
  this->block_size = block_size;
  (this->superblock_mins).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->superblock_mins).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->superblock_mins).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->block_mins).
  super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->block_mins).
  super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->block_mins).
  super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c0 = begin._M_current;
  if ((long)end._M_current - (long)begin._M_current == -8) {
    __assert_fail("(index_t)std::distance(begin, end) < std::numeric_limits<index_t>::max()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/rmq.hpp"
                  ,0x50,
                  "rmq<__gnu_cxx::__normal_iterator<const unsigned long *, std::vector<unsigned long>>>::rmq(Iterator, Iterator, index_t, index_t) [Iterator = __gnu_cxx::__normal_iterator<const unsigned long *, std::vector<unsigned long>>, index_t = unsigned long]"
                 );
  }
  uVar18 = (long)end._M_current - (long)begin._M_current >> 3;
  this->n = uVar18;
  if (superblock_size % block_size != 0) {
    __assert_fail("superblock_size % block_size == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/rmq.hpp"
                  ,0x55,
                  "rmq<__gnu_cxx::__normal_iterator<const unsigned long *, std::vector<unsigned long>>>::rmq(Iterator, Iterator, index_t, index_t) [Iterator = __gnu_cxx::__normal_iterator<const unsigned long *, std::vector<unsigned long>>, index_t = unsigned long]"
                 );
  }
  uVar19 = uVar18 - 1;
  __n = uVar19 / superblock_size + 1;
  this->n_superblocks = __n;
  this->n_blocks = uVar19 / block_size + 1;
  this->n_blocks_per_superblock = superblock_size / block_size;
  local_88 = superblock_size;
  if (superblock_size - 0x10001 < 0xffffffffffff0000) {
    __assert_fail("superblock_size-1 <= std::numeric_limits<uint16_t>::max()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/rmq.hpp"
                  ,0x5c,
                  "rmq<__gnu_cxx::__normal_iterator<const unsigned long *, std::vector<unsigned long>>>::rmq(Iterator, Iterator, index_t, index_t) [Iterator = __gnu_cxx::__normal_iterator<const unsigned long *, std::vector<unsigned long>>, index_t = unsigned long]"
                 );
  }
  this_00 = &this->superblock_mins;
  local_b8 = (vector<std::vector<unsigned_short,std::allocator<unsigned_short>>,std::allocator<std::vector<unsigned_short,std::allocator<unsigned_short>>>>
              *)&this->block_mins;
  local_c8 = this;
  local_80 = this_00;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_a0,__n,&local_c9);
  std::
  vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
  ::emplace_back<std::vector<unsigned_long,std::allocator<unsigned_long>>>
            ((vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
              *)this_00,&local_a0);
  if (local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_a0,local_c8->n_blocks
             ,(allocator_type *)&local_c9);
  std::
  vector<std::vector<unsigned_short,std::allocator<unsigned_short>>,std::allocator<std::vector<unsigned_short,std::allocator<unsigned_short>>>>
  ::emplace_back<std::vector<unsigned_short,std::allocator<unsigned_short>>>
            (local_b8,(vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_a0);
  if (local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_c0 != end._M_current) {
    pvVar3 = (this_00->
             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    puVar11 = local_c0;
    do {
      uVar19 = (long)end._M_current - (long)puVar11 >> 3;
      if (local_88 <= uVar19) {
        uVar19 = local_88;
      }
      puVar1 = puVar11 + uVar19;
      puVar16 = puVar11;
      if (end._M_current != puVar11) {
        plVar4 = *(long **)local_b8;
        puVar8 = puVar11;
        do {
          uVar19 = (long)end._M_current - (long)puVar8 >> 3;
          if (block_size <= uVar19) {
            uVar19 = block_size;
          }
          puVar22 = puVar8;
          if (uVar19 != 1 && (long)end._M_current - (long)puVar8 != 0) {
            uVar25 = *puVar8;
            lVar24 = uVar19 * 8 + -8;
            puVar29 = puVar8;
            do {
              puVar29 = puVar29 + 1;
              if (*puVar29 < uVar25) {
                puVar22 = puVar29;
                uVar25 = *puVar29;
              }
              lVar24 = lVar24 + -8;
            } while (lVar24 != 0);
          }
          uVar25 = (long)puVar22 - (long)puVar11 >> 3;
          if (local_88 <= uVar25) {
            __assert_fail("block_min_idx < superblock_size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/rmq.hpp"
                          ,0x73,
                          "rmq<__gnu_cxx::__normal_iterator<const unsigned long *, std::vector<unsigned long>>>::rmq(Iterator, Iterator, index_t, index_t) [Iterator = __gnu_cxx::__normal_iterator<const unsigned long *, std::vector<unsigned long>>, index_t = unsigned long]"
                         );
          }
          puVar29 = puVar8 + uVar19;
          if (*puVar22 < *puVar16) {
            puVar16 = puVar22;
          }
          *(short *)(*plVar4 + ((ulong)((long)puVar8 - (long)local_c0 >> 3) / block_size) * 2) =
               (short)uVar25;
          puVar8 = puVar29;
        } while (puVar29 != puVar1);
      }
      *(long *)(*(long *)&(pvVar3->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          )._M_impl + ((ulong)((long)puVar11 - (long)local_c0 >> 3) / local_88) * 8)
           = (long)puVar16 - (long)local_c0 >> 3;
      puVar11 = puVar1;
    } while (puVar1 != end._M_current);
  }
  uVar19 = local_c8->n_superblocks;
  if (1 < uVar19) {
    local_b0 = 2;
    uVar25 = 1;
    lVar24 = 1;
    do {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&local_a0,uVar19 - uVar25,&local_c9);
      std::
      vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
      ::emplace_back<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                ((vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                  *)this_00,&local_a0);
      if (local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      uVar19 = local_c8->n_superblocks;
      if (uVar25 < uVar19) {
        pvVar3 = (local_c8->superblock_mins).
                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pvVar5 = (local_c8->superblock_mins).
                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        local_a8 = pvVar3 + lVar24;
        lVar9 = *(long *)&local_a8[-1].
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data;
        puVar6 = pvVar5[-1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        lVar20 = ((long)pvVar5 - (long)pvVar3 >> 3) * -0x5555555555555555;
        uVar17 = (long)pvVar5[-1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)puVar6 >> 3;
        uVar23 = 0;
        do {
          uVar19 = uVar19 + ~(local_b0 >> 2);
          if (uVar25 + uVar23 <= uVar19) {
            uVar19 = uVar25 + uVar23;
          }
          uVar18 = *(unsigned_long *)(lVar9 + uVar23 * 8);
          uVar26 = *(unsigned_long *)(lVar9 + uVar19 * 8);
          if (local_c0[uVar18] < local_c0[uVar26]) {
            if (uVar17 <= uVar23) {
              __assert_fail("i < superblock_mins.back().size()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/rmq.hpp"
                            ,0x82,
                            "rmq<__gnu_cxx::__normal_iterator<const unsigned long *, std::vector<unsigned long>>>::rmq(Iterator, Iterator, index_t, index_t) [Iterator = __gnu_cxx::__normal_iterator<const unsigned long *, std::vector<unsigned long>>, index_t = unsigned long]"
                           );
            }
            uVar26 = uVar18;
            if (lVar20 - (lVar24 + 1) != 0) {
              __assert_fail("superblock_mins.size() == level+1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/rmq.hpp"
                            ,0x83,
                            "rmq<__gnu_cxx::__normal_iterator<const unsigned long *, std::vector<unsigned long>>>::rmq(Iterator, Iterator, index_t, index_t) [Iterator = __gnu_cxx::__normal_iterator<const unsigned long *, std::vector<unsigned long>>, index_t = unsigned long]"
                           );
            }
          }
          else {
            if (uVar17 <= uVar23) {
              __assert_fail("i < superblock_mins.back().size()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/rmq.hpp"
                            ,0x86,
                            "rmq<__gnu_cxx::__normal_iterator<const unsigned long *, std::vector<unsigned long>>>::rmq(Iterator, Iterator, index_t, index_t) [Iterator = __gnu_cxx::__normal_iterator<const unsigned long *, std::vector<unsigned long>>, index_t = unsigned long]"
                           );
            }
            if (lVar20 - (lVar24 + 1) != 0) {
              __assert_fail("superblock_mins.size() == level+1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/rmq.hpp"
                            ,0x87,
                            "rmq<__gnu_cxx::__normal_iterator<const unsigned long *, std::vector<unsigned long>>>::rmq(Iterator, Iterator, index_t, index_t) [Iterator = __gnu_cxx::__normal_iterator<const unsigned long *, std::vector<unsigned long>>, index_t = unsigned long]"
                           );
            }
            if ((ulong)((long)*(pointer *)
                               ((long)&local_a8[-1].
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data + 8) - lVar9 >> 3) <= uVar19
               ) {
              __assert_fail("superblock_mins[level-1].size() > right_idx",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/rmq.hpp"
                            ,0x88,
                            "rmq<__gnu_cxx::__normal_iterator<const unsigned long *, std::vector<unsigned long>>>::rmq(Iterator, Iterator, index_t, index_t) [Iterator = __gnu_cxx::__normal_iterator<const unsigned long *, std::vector<unsigned long>>, index_t = unsigned long]"
                           );
            }
          }
          puVar6[uVar23] = uVar26;
          uVar19 = local_c8->n_superblocks;
          lVar21 = uVar25 + uVar23;
          uVar23 = uVar23 + 1;
        } while (lVar21 + 1U < uVar19);
      }
      lVar24 = lVar24 + 1;
      uVar17 = local_b0 * 2;
      uVar25 = local_b0 & 0x7ffffffffffffffe;
      local_b0 = uVar17;
    } while (uVar25 < uVar19);
  }
  uVar25 = local_c8->n_blocks;
  uVar17 = local_c8->n_blocks_per_superblock;
  uVar23 = uVar25;
  if (uVar17 < uVar25) {
    uVar23 = uVar17;
  }
  if (1 < uVar23) {
    local_78 = uVar25 - (uVar19 - 1) * uVar17;
    uVar15 = 1;
    lVar24 = 1;
    prVar30 = local_c8;
    uVar23 = 2;
    do {
      if (uVar25 == uVar19 * uVar23 >> 1) {
        return;
      }
      lVar9 = local_78 - uVar15;
      if (local_78 < uVar15) {
        lVar9 = 0;
      }
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_a0,
                 (uVar17 - uVar15) * (uVar19 - 1) + lVar9,(allocator_type *)&local_c9);
      std::
      vector<std::vector<unsigned_short,std::allocator<unsigned_short>>,std::allocator<std::vector<unsigned_short,std::allocator<unsigned_short>>>>
      ::emplace_back<std::vector<unsigned_short,std::allocator<unsigned_short>>>
                (local_b8,(vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_a0);
      if (local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      uVar13 = prVar30->n_blocks;
      uVar19 = prVar30->n_superblocks;
      uVar17 = prVar30->n_blocks_per_superblock;
      uVar25 = uVar13;
      if (uVar19 != 0) {
        uVar25 = uVar23 >> 2;
        local_50 = uVar17 - uVar25;
        local_58 = ~uVar25;
        local_60 = lVar24 * 0x18 + *(long *)local_b8;
        local_48 = uVar17 * 2 + uVar15 * -2;
        local_40 = uVar17 * 2 + uVar25 * -2;
        local_a8 = (pointer)0x0;
        lVar9 = 0;
        uVar28 = 0;
        uVar25 = uVar13;
        do {
          uVar12 = uVar25;
          if (uVar17 < uVar25) {
            uVar12 = uVar17;
          }
          uVar14 = uVar13 - uVar17 * uVar28;
          if (uVar17 < uVar14) {
            uVar14 = uVar17;
          }
          if (uVar15 < uVar14) {
            lVar20 = *(long *)(local_60 + -0x18);
            puVar7 = (local_c8->block_mins).
                     super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish[-1].
                     super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                     super__Vector_impl_data._M_start;
            lVar21 = 0;
            do {
              uVar10 = uVar15 + lVar21;
              if (uVar14 + local_58 < uVar15 + lVar21) {
                uVar10 = uVar14 + local_58;
              }
              uVar27 = *(ushort *)
                        ((long)&(local_a8->
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                _M_impl.super__Vector_impl_data + lVar21 * 2 + lVar20);
              uVar2 = *(ushort *)(lVar20 + local_50 * uVar28 * 2 + uVar10 * 2);
              if (local_c0[uVar28 * local_88 + (ulong)uVar2] <=
                  local_c0[uVar28 * local_88 + (ulong)uVar27]) {
                uVar27 = uVar2;
              }
              *(ushort *)((long)puVar7 + lVar21 * 2 + lVar9) = uVar27;
              lVar21 = lVar21 + 1;
            } while ((uVar15 - uVar12) + lVar21 != 0);
          }
          uVar28 = uVar28 + 1;
          uVar25 = uVar25 - uVar17;
          lVar9 = lVar9 + local_48;
          local_a8 = (pointer)((long)local_a8 + local_40);
        } while (uVar28 != uVar19);
        uVar25 = local_c8->n_blocks;
        uVar17 = local_c8->n_blocks_per_superblock;
        prVar30 = local_c8;
        local_b0 = uVar19;
        local_70 = lVar24;
        local_68 = uVar23;
        local_38 = uVar13;
      }
      lVar24 = lVar24 + 1;
      uVar15 = uVar23 & 0x7ffffffffffffffe;
      uVar13 = uVar25;
      if (uVar17 < uVar25) {
        uVar13 = uVar17;
      }
      uVar23 = uVar23 * 2;
    } while (uVar15 < uVar13);
  }
  return;
}

Assistant:

rmq(Iterator begin, Iterator end,
        index_t superblock_size = DEFAULT_SUPERBLOCK_SIZE,
        index_t block_size = DEFAULT_BLOCK_SIZE)
        : _begin(begin), _end(end), superblock_size(superblock_size), block_size(block_size)
    {
        // get size
        assert((index_t)std::distance(begin, end) < std::numeric_limits<index_t>::max());
        n = std::distance(begin, end);


        // superblock size should be divisable by block size
        assert(superblock_size % block_size == 0);

        // get number of blocks
        n_superblocks = (n-1) / superblock_size + 1;
        n_blocks = (n-1) / block_size + 1;
        n_blocks_per_superblock = superblock_size / block_size;

        assert(superblock_size-1 <= std::numeric_limits<uint16_t>::max());


        // start by finding index of mins per block
        // for each superblock
        superblock_mins.push_back(std::vector<index_t>(n_superblocks));
        block_mins.push_back(std::vector<uint16_t>(n_blocks));
        Iterator it = begin;
        while (it != end) {
            // find index of minimum block in superblock
            Iterator min_pos = it;
            Iterator sb_end_it = it;
            std::advance(sb_end_it, std::min<std::size_t>(std::distance(it, end), superblock_size));
            for (Iterator block_it = it; block_it != sb_end_it; ) {
                Iterator block_end_it = block_it;
                std::advance(block_end_it, std::min<std::size_t>(std::distance(block_it, end), block_size));
                Iterator block_min_pos = std::min_element(block_it, block_end_it);
                // save minimum for superblock min
                if (*block_min_pos < *min_pos) {
                    min_pos = block_min_pos;
                }
                // save minimum for block min, relative to superblock start
                index_t block_min_idx = static_cast<index_t>(std::distance(it, block_min_pos));
                assert(block_min_idx < superblock_size);
                block_mins[0][std::distance(begin, block_it) / block_size] = static_cast<uint16_t>(block_min_idx);
                block_it = block_end_it;
            }
            superblock_mins[0][std::distance(begin, it) / superblock_size] = static_cast<index_t>(std::distance(begin, min_pos));
            it = sb_end_it;
        }

        // fill superblock lookup with dynamic programming
        index_t level = 1;
        for (index_t dist = 2; dist/2 < n_superblocks; dist <<= 1) {
            superblock_mins.push_back(std::vector<index_t>(n_superblocks - dist/2));
            for (index_t i = 0; i+dist/2 < n_superblocks; ++i) {
                index_t right_idx = std::min(i+dist/2, n_superblocks-dist/4-1);
                if (*(begin + superblock_mins[level-1][i]) < *(begin + superblock_mins[level-1][right_idx])) {
                    assert(i < superblock_mins.back().size());
                    assert(superblock_mins.size() == level+1);
                    superblock_mins.back()[i] = superblock_mins[level-1][i];
                } else {
                    assert(i < superblock_mins.back().size());
                    assert(superblock_mins.size() == level+1);
                    assert(superblock_mins[level-1].size() > right_idx);
                    superblock_mins.back()[i] = superblock_mins[level-1][right_idx];
                }
            }
            level++;
        }

        // now the same thing for blocks (but index relative to their
        // superblock)
        level = 1;
        index_t last_sb_nblocks = n_blocks - (n_superblocks-1)*n_blocks_per_superblock;
        for (index_t dist = 2; dist/2 < std::min(n_blocks,n_blocks_per_superblock); dist <<= 1) {
            if (n_blocks - n_superblocks*dist/2 == 0)
                break;
            index_t last_sb_cur_nblocks = 0;
            if (last_sb_nblocks > dist/2)
                last_sb_cur_nblocks = last_sb_nblocks - dist/2;
            block_mins.push_back(std::vector<uint16_t>((n_superblocks-1)*(n_blocks_per_superblock - dist/2) + last_sb_cur_nblocks));
            for (index_t sb = 0; sb < n_superblocks; ++sb) {
                index_t pre_sb_offset = sb*(n_blocks_per_superblock - dist/4);
                index_t sb_offset = sb*(n_blocks_per_superblock - dist/2);
                index_t blocks_in_sb = std::min(n_blocks - sb*n_blocks_per_superblock, n_blocks_per_superblock);
                for (index_t i = 0; i+dist/2 < blocks_in_sb; ++i) {
                    // TODO: right_idx might become negative for last superblock??
                    index_t right_idx = std::min(i + dist/2, blocks_in_sb-dist/4-1);
                    if (*(begin + block_mins[level-1][i        +pre_sb_offset] + sb*superblock_size)
                      < *(begin + block_mins[level-1][right_idx+pre_sb_offset] + sb*superblock_size))
                    {
                        block_mins.back()[i+sb_offset] = block_mins[level-1][i+pre_sb_offset];
                    } else {
                        block_mins.back()[i+sb_offset] = block_mins[level-1][right_idx+pre_sb_offset];
                    }
                }
            }
            level++;
        }

        //assert(check_superblock_correctness());
        //assert(check_block_correctness());
    }